

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_priority_queue.c
# Opt level: O2

void percolate_down(roaring_pq_t *pq,uint32_t i)

{
  uint uVar1;
  ulong uVar2;
  roaring_bitmap_t *prVar3;
  _Bool _Var4;
  undefined7 uVar5;
  uint uVar6;
  ulong uVar8;
  roaring_pq_element_t *prVar9;
  ulong uVar10;
  uint uVar11;
  undefined8 local_38;
  roaring_bitmap_t *prStack_30;
  ulong uVar7;
  
  uVar1 = (uint)pq->size;
  uVar2 = pq->elements[i].size;
  prVar9 = pq->elements + i;
  _Var4 = prVar9->is_temporary;
  uVar5 = *(undefined7 *)&prVar9->field_0x9;
  prVar3 = *(roaring_bitmap_t **)(&prVar9->is_temporary + 8);
  uVar7 = (ulong)i;
  while (uVar6 = (uint)uVar7, uVar6 < uVar1 >> 1) {
    uVar11 = uVar6 * 2 + 2;
    uVar8 = (ulong)(uVar6 * 2 + 1);
    prVar9 = pq->elements;
    uVar10 = prVar9[uVar8].size;
    local_38 = *(undefined8 *)&prVar9[uVar8].is_temporary;
    prStack_30 = *(roaring_bitmap_t **)(&prVar9[uVar8].is_temporary + 8);
    if (uVar11 < uVar1) {
      if (prVar9[uVar11].size < uVar10) {
        local_38 = *(undefined8 *)&prVar9[uVar11].is_temporary;
        prStack_30 = prVar9[uVar11].bitmap;
        uVar8 = (ulong)uVar11;
        uVar10 = prVar9[uVar11].size;
      }
    }
    if (uVar2 <= uVar10) goto LAB_00109419;
    prVar9[uVar7].size = uVar10;
    *(undefined8 *)&prVar9[uVar7].is_temporary = local_38;
    *(roaring_bitmap_t **)(&prVar9[uVar7].is_temporary + 8) = prStack_30;
    uVar7 = uVar8;
  }
  prVar9 = pq->elements;
LAB_00109419:
  prVar9[uVar7].size = uVar2;
  prVar9 = prVar9 + uVar7;
  prVar9->is_temporary = _Var4;
  *(undefined7 *)&prVar9->field_0x9 = uVar5;
  *(roaring_bitmap_t **)(&prVar9->is_temporary + 8) = prVar3;
  return;
}

Assistant:

static void percolate_down(roaring_pq_t *pq, uint32_t i) {
    uint32_t size = (uint32_t)pq->size;
    uint32_t hsize = size >> 1;
    roaring_pq_element_t ai = pq->elements[i];
    while (i < hsize) {
        uint32_t l = (i << 1) + 1;
        uint32_t r = l + 1;
        roaring_pq_element_t bestc = pq->elements[l];
        if (r < size) {
            if (compare(pq->elements + r, &bestc)) {
                l = r;
                bestc = pq->elements[r];
            }
        }
        if (!compare(&bestc, &ai)) {
            break;
        }
        pq->elements[i] = bestc;
        i = l;
    }
    pq->elements[i] = ai;
}